

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O1

CURLcode cf_hc_shutdown(Curl_cfilter *cf,Curl_easy *data,_Bool *done)

{
  CURLcode CVar1;
  long lVar2;
  curl_trc_feat *pcVar3;
  int iVar4;
  long lVar5;
  CURLcode CVar6;
  _Bool bdone;
  cf_hc_baller *ballers [2];
  char local_49;
  long local_48 [3];
  
  if ((cf->field_0x24 & 1) == 0) {
    local_48[0] = (long)cf->ctx + 0x28;
    local_48[1] = (long)cf->ctx + 0x58;
    lVar5 = 0;
    do {
      lVar2 = local_48[lVar5];
      local_49 = '\0';
      if (((((*(byte *)(lVar2 + 0x2c) & 1) != 0) && (*(long *)(lVar2 + 8) != 0)) &&
          ((*(byte *)(lVar2 + 0x2c) & 2) == 0)) && (*(int *)(lVar2 + 0x10) == 0)) {
        iVar4 = (**(code **)(**(long **)(lVar2 + 8) + 0x28))(*(long **)(lVar2 + 8),data,&local_49);
        *(int *)(lVar2 + 0x10) = iVar4;
        if ((iVar4 != 0) || (local_49 == '\x01')) {
          *(byte *)(lVar2 + 0x2c) = *(byte *)(lVar2 + 0x2c) | 2;
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 == 1);
    *done = true;
    lVar5 = 0;
    do {
      if ((local_48[lVar5] != 0) && ((*(byte *)(local_48[lVar5] + 0x2c) & 2) == 0)) {
        *done = false;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 == 1);
    CVar6 = CURLE_OK;
    if (*done == true) {
      CVar6 = CURLE_OK;
      lVar5 = 0;
      do {
        if ((local_48[lVar5] != 0) &&
           (CVar1 = *(CURLcode *)(local_48[lVar5] + 0x10), CVar1 != CURLE_OK)) {
          CVar6 = CVar1;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 == 1);
    }
    if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
      pcVar3 = (data->state).feat;
      if (pcVar3 == (curl_trc_feat *)0x0) {
        if (cf == (Curl_cfilter *)0x0) {
          return CVar6;
        }
      }
      else {
        if (cf == (Curl_cfilter *)0x0) {
          return CVar6;
        }
        if (pcVar3->log_level < 1) {
          return CVar6;
        }
      }
      if (0 < cf->cft->log_level) {
        Curl_trc_cf_infof(data,cf,"shutdown -> %d, done=%d",(ulong)CVar6);
      }
    }
  }
  else {
    *done = true;
    CVar6 = CURLE_OK;
  }
  return CVar6;
}

Assistant:

static CURLcode cf_hc_shutdown(struct Curl_cfilter *cf,
                               struct Curl_easy *data, bool *done)
{
  struct cf_hc_ctx *ctx = cf->ctx;
  struct cf_hc_baller *ballers[2];
  size_t i;
  CURLcode result = CURLE_OK;

  DEBUGASSERT(data);
  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  /* shutdown all ballers that have not done so already. If one fails,
   * continue shutting down others until all are shutdown. */
  ballers[0] = &ctx->h3_baller;
  ballers[1] = &ctx->h21_baller;
  for(i = 0; i < sizeof(ballers)/sizeof(ballers[0]); i++) {
    struct cf_hc_baller *b = ballers[i];
    bool bdone = FALSE;
    if(!cf_hc_baller_is_active(b) || b->shutdown)
      continue;
    b->result = b->cf->cft->do_shutdown(b->cf, data, &bdone);
    if(b->result || bdone)
      b->shutdown = TRUE; /* treat a failed shutdown as done */
  }

  *done = TRUE;
  for(i = 0; i < sizeof(ballers)/sizeof(ballers[0]); i++) {
    if(ballers[i] && !ballers[i]->shutdown)
      *done = FALSE;
  }
  if(*done) {
    for(i = 0; i < sizeof(ballers)/sizeof(ballers[0]); i++) {
      if(ballers[i] && ballers[i]->result)
        result = ballers[i]->result;
    }
  }
  CURL_TRC_CF(data, cf, "shutdown -> %d, done=%d", result, *done);
  return result;
}